

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s3io.c
# Opt level: O1

int awritefloat(char *file,float *data,int length)

{
  float fVar1;
  int __fd;
  ssize_t sVar2;
  ulong uVar3;
  size_t sVar4;
  undefined1 local_34 [4];
  
  __fd = open(file,0x241,0x1a4);
  if (__fd < 0) {
    awritefloat_cold_3();
  }
  else {
    sVar2 = write(__fd,local_34,4);
    if (sVar2 == 4) {
      if (0 < length) {
        uVar3 = 0;
        do {
          fVar1 = data[uVar3];
          data[uVar3] = (float)((uint)fVar1 >> 0x18 | ((uint)fVar1 & 0xff0000) >> 8 |
                                ((uint)fVar1 & 0xff00) << 8 | (int)fVar1 << 0x18);
          uVar3 = uVar3 + 1;
        } while ((uint)length != uVar3);
      }
      sVar4 = write(__fd,data,(long)(length * 4));
      if (sVar4 == (long)(length * 4)) {
        if (0 < length) {
          uVar3 = 0;
          do {
            fVar1 = data[uVar3];
            data[uVar3] = (float)((uint)fVar1 >> 0x18 | ((uint)fVar1 & 0xff0000) >> 8 |
                                  ((uint)fVar1 & 0xff00) << 8 | (int)fVar1 << 0x18);
            uVar3 = uVar3 + 1;
          } while ((uint)length != uVar3);
        }
        printf("Wrote %d floats in %s.\n",(ulong)(uint)length,file);
        close(__fd);
        return length;
      }
      awritefloat_cold_2();
    }
    else {
      awritefloat_cold_1();
    }
  }
  return -1;
}

Assistant:

int
awritefloat (char *file,
	     float *data,
	     int length)
{
  int             fd;
  int             size;
  int             offset;

  if ((fd = open (file, O_CREAT | O_WRONLY | O_TRUNC | O_BINARY, 0644)) < 0)
  {
    fprintf (stderr, "awritefloat: %s: can't create\n", file);
    perror("");
    return -1;
  }

  SWAP_INT32(&length);
  if (write (fd, (char *) &length, 4) != 4)
  {
    fprintf (stderr, "awritefloat: %s: can't write length\n", file);
    perror("");
    close (fd);
    return -1;
  }
  SWAP_INT32(&length);

  for(offset = 0; offset < length; offset++)
    SWAP_FLOAT32(data + offset);
  size = length * sizeof (float);
  if (write (fd, (char *) data, size) != size)
  {
    fprintf (stderr, "awritefloat: %s: can't write data\n", file);
    perror("");
    close (fd);
    return (-1);
  }
  for(offset = 0; offset < length; offset++)
    SWAP_FLOAT32(data + offset);

  printf ("Wrote %d floats in %s.\n", length, file);
  close (fd);
  return length;
}